

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::GetterError<long_long>::GetterError
          (GetterError<long_long> *this,longlong *xs,longlong *ys,longlong *neg,longlong *pos,
          int count,int offset,int stride)

{
  int local_4c;
  int count_local;
  longlong *pos_local;
  longlong *neg_local;
  longlong *ys_local;
  longlong *xs_local;
  GetterError<long_long> *this_local;
  
  this->Xs = xs;
  this->Ys = ys;
  this->Neg = neg;
  this->Pos = pos;
  this->Count = count;
  if (count == 0) {
    local_4c = 0;
  }
  else {
    local_4c = ImPosMod(offset,count);
  }
  this->Offset = local_4c;
  this->Stride = stride;
  return;
}

Assistant:

GetterError(const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) :
        Xs(xs),
        Ys(ys),
        Neg(neg),
        Pos(pos),
        Count(count),
        Offset(count ? ImPosMod(offset, count) : 0),
        Stride(stride)
    { }